

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caption.c
# Opt level: O1

size_t caption_frame_dump_buffer(caption_frame_t *frame,utf8_char_t *buf)

{
  int iVar1;
  int iVar2;
  size_t sVar3;
  long lVar4;
  char *pcVar5;
  utf8_char_t *puVar6;
  long lVar7;
  utf8_char_t *puVar8;
  utf8_char_t *puVar9;
  long lVar10;
  
  iVar1 = sprintf(buf,"   timestamp: %f\n   row: %02d    col: %02d    roll-up: %d\n",
                  frame->timestamp,(ulong)(uint)(int)(frame->state).row,
                  (ulong)(uint)(int)(frame->state).col,
                  (ulong)*(uint *)((long)_caption_frame_rollup +
                                  (ulong)(*(byte *)&frame->state >> 2 & 0xc)));
  iVar2 = sprintf(buf + iVar1,
                  "   00000000001111111111222222222233\t   00000000001111111111222222222233\n   01234567890123456789012345678901\t   01234567890123456789012345678901\n  %s--------------------------------%s\t  %s--------------------------------%s\n"
                  ,anon_var_dwarf_494,anon_var_dwarf_49f,anon_var_dwarf_494,anon_var_dwarf_49f);
  lVar10 = (long)iVar1 + (long)iVar2;
  pcVar5 = buf + iVar1 + iVar2;
  puVar8 = (frame->front).cell[0][0].data;
  puVar9 = (frame->back).cell[0][0].data;
  lVar4 = 0;
  do {
    iVar1 = sprintf(pcVar5,"%02d%s",lVar4,"|");
    lVar10 = lVar10 + iVar1;
    puVar6 = pcVar5 + iVar1;
    lVar7 = 0;
    do {
      pcVar5 = " ";
      if (puVar8[lVar7] != '\0') {
        pcVar5 = puVar8 + lVar7;
      }
      sVar3 = utf8_char_copy(puVar6,pcVar5);
      lVar10 = lVar10 + sVar3;
      puVar6 = puVar6 + sVar3;
      lVar7 = lVar7 + 8;
    } while (lVar7 != 0x100);
    iVar1 = sprintf(puVar6,"%s\t%02d%s","|",lVar4,"|");
    lVar10 = lVar10 + iVar1;
    puVar6 = puVar6 + iVar1;
    lVar7 = 0;
    do {
      pcVar5 = " ";
      if (puVar9[lVar7] != '\0') {
        pcVar5 = puVar9 + lVar7;
      }
      sVar3 = utf8_char_copy(puVar6,pcVar5);
      lVar10 = lVar10 + sVar3;
      puVar6 = puVar6 + sVar3;
      lVar7 = lVar7 + 8;
    } while (lVar7 != 0x100);
    iVar1 = sprintf(puVar6,"%s\n","|");
    lVar10 = lVar10 + iVar1;
    pcVar5 = puVar6 + iVar1;
    lVar4 = lVar4 + 1;
    puVar8 = puVar8 + 0x100;
    puVar9 = puVar9 + 0x100;
  } while (lVar4 != 0xf);
  iVar1 = sprintf(pcVar5,
                  "  %s--------------------------------%s\t  %s--------------------------------%s\n"
                  ,anon_var_dwarf_51c,anon_var_dwarf_527,anon_var_dwarf_51c,anon_var_dwarf_527);
  return lVar10 + iVar1;
}

Assistant:

size_t caption_frame_dump_buffer(caption_frame_t* frame, utf8_char_t* buf)
{
    int r, c;
    size_t bytes, total = 0;
    bytes = sprintf(buf, "   timestamp: %f\n   row: %02d    col: %02d    roll-up: %d\n",
        frame->timestamp, frame->state.row, frame->state.col, caption_frame_rollup(frame));
    total += bytes, buf += bytes;
    bytes = sprintf(buf, "   00000000001111111111222222222233\t   00000000001111111111222222222233\n"
                         "   01234567890123456789012345678901\t   01234567890123456789012345678901\n"
                         "  %s--------------------------------%s\t  %s--------------------------------%s\n",
        EIA608_CHAR_BOX_DRAWINGS_LIGHT_DOWN_AND_RIGHT, EIA608_CHAR_BOX_DRAWINGS_LIGHT_DOWN_AND_LEFT,
        EIA608_CHAR_BOX_DRAWINGS_LIGHT_DOWN_AND_RIGHT, EIA608_CHAR_BOX_DRAWINGS_LIGHT_DOWN_AND_LEFT);
    total += bytes;
    buf += bytes;

    for (r = 0; r < SCREEN_ROWS; ++r) {
        bytes = sprintf(buf, "%02d%s", r, EIA608_CHAR_VERTICAL_LINE);
        total += bytes, buf += bytes;

        // front buffer
        for (c = 0; c < SCREEN_COLS; ++c) {
            caption_frame_cell_t* cell = frame_buffer_cell(&frame->front, r, c);
            bytes = utf8_char_copy(buf, (!cell || 0 == cell->data[0]) ? EIA608_CHAR_SPACE : &cell->data[0]);
            total += bytes, buf += bytes;
        }

        bytes = sprintf(buf, "%s\t%02d%s", EIA608_CHAR_VERTICAL_LINE, r, EIA608_CHAR_VERTICAL_LINE);
        total += bytes, buf += bytes;

        // back buffer
        for (c = 0; c < SCREEN_COLS; ++c) {
            caption_frame_cell_t* cell = frame_buffer_cell(&frame->back, r, c);
            bytes = utf8_char_copy(buf, (!cell || 0 == cell->data[0]) ? EIA608_CHAR_SPACE : &cell->data[0]);
            total += bytes, buf += bytes;
        }

        bytes = sprintf(buf, "%s\n", EIA608_CHAR_VERTICAL_LINE);
        total += bytes, buf += bytes;
    }

    bytes = sprintf(buf, "  %s--------------------------------%s\t  %s--------------------------------%s\n",
        EIA608_CHAR_BOX_DRAWINGS_LIGHT_UP_AND_RIGHT, EIA608_CHAR_BOX_DRAWINGS_LIGHT_UP_AND_LEFT,
        EIA608_CHAR_BOX_DRAWINGS_LIGHT_UP_AND_RIGHT, EIA608_CHAR_BOX_DRAWINGS_LIGHT_UP_AND_LEFT);
    total += bytes, buf += bytes;
    return total;
}